

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex_p.h
# Opt level: O2

void __thiscall
QGraphicsSceneIndexPrivate::items_helper
          (QGraphicsSceneIndexPrivate *this,QRectF *rect,QGraphicsSceneIndexIntersector intersect,
          QList<QGraphicsItem_*> *items,QTransform *viewTransform,ItemSelectionMode mode,
          SortOrder order,void *intersectData)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  undefined1 *puVar3;
  ulong i_00;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)&this->field_0x8 + 0x98))(&local_58,*(long **)&this->field_0x8,rect,0);
  for (puVar3 = (undefined1 *)0x0; puVar3 < (ulong)local_58.size; puVar3 = puVar3 + 1) {
    recursive_items_helper
              (this,*(QGraphicsItem **)
                     (CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + (long)puVar3 * 8),*rect,
               intersect,items,viewTransform,mode,1.0,intersectData);
  }
  if (order == DescendingOrder) {
    uVar1 = (items->d).size;
    uVar2 = (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2;
    i_00 = 0;
    uVar5 = uVar2 & 0xffffffff;
    if ((int)uVar2 < 1) {
      uVar5 = i_00;
    }
    lVar4 = uVar1 << 0x20;
    for (; lVar4 = lVar4 + -0x100000000, uVar5 != i_00; i_00 = i_00 + 1) {
      QList<QGraphicsItem_*>::swapItemsAt(items,i_00,lVar4 >> 0x20);
    }
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QGraphicsSceneIndexPrivate::items_helper(const QRectF &rect, QGraphicsSceneIndexIntersector intersect,
                                                     QList<QGraphicsItem *> *items, const QTransform &viewTransform,
                                                     Qt::ItemSelectionMode mode, Qt::SortOrder order, const void *intersectData) const
{
    Q_Q(const QGraphicsSceneIndex);
    const QList<QGraphicsItem *> tli = q->estimateTopLevelItems(rect, Qt::AscendingOrder);
    for (int i = 0; i < tli.size(); ++i)
        recursive_items_helper(tli.at(i), rect, intersect, items, viewTransform, mode, 1.0, intersectData);
    if (order == Qt::DescendingOrder) {
        const int n = items->size();
        for (int i = 0; i < n / 2; ++i)
            items->swapItemsAt(i, n - i - 1);
    }
}